

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void Database::create(string *fname)

{
  bool bVar1;
  runtime_error *this;
  ExclusiveFile lock;
  Database empty;
  
  ExclusiveFile::ExclusiveFile(&lock,fname);
  bVar1 = ExclusiveFile::is_ok(&lock);
  if (bVar1) {
    Database(&empty,fname,false);
    save(&empty);
    ~Database(&empty);
    ExclusiveFile::~ExclusiveFile(&lock);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"File already exists");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Database::create(const std::string &fname) {
    ExclusiveFile lock(fname);
    if (!lock.is_ok()) {
        throw std::runtime_error("File already exists");
    }
    Database empty(fname, false);
    empty.save();
}